

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_flats.cpp
# Opt level: O1

void __thiscall GLFlat::SetupSubsectorLights(GLFlat *this,int pass,subsector_t *sub,int *dli)

{
  uint *puVar1;
  double dVar2;
  ADynamicLight *light;
  FLightBuffer *this_00;
  int index;
  FLightNode *pFVar3;
  double dVar4;
  Plane p;
  Plane local_44;
  
  local_44.m_normal.m_vec[0] = 0.0;
  local_44.m_normal.m_vec[1] = 1.0;
  local_44.m_normal.m_vec[2] = 0.0;
  local_44.m_normal.m_length = -1.0;
  local_44.m_d = 0.0;
  if (this->renderstyle != STYLE_Add) {
    if ((dli == (int *)0x0) || ((long)*dli == -1)) {
      if (lightdata.arrays[0].Count != 0) {
        lightdata.arrays[0].Count = 0;
      }
      if (lightdata.arrays[1].Count != 0) {
        lightdata.arrays[1].Count = 0;
      }
      if (lightdata.arrays[2].Count != 0) {
        lightdata.arrays[2].Count = 0;
      }
      pFVar3 = sub->lighthead;
      if (pFVar3 != (FLightNode *)0x0) {
        do {
          light = pFVar3->lightsource;
          if (((light->super_AActor).flags2.Value & 0x10000000) == 0) {
            iter_dlightf = iter_dlightf + 1;
            if (gl_lights_checkside.Value == true) {
              dVar4 = ((light->super_AActor).__Pos.Y * (this->plane).plane.normal.Y +
                      (light->super_AActor).__Pos.X * (this->plane).plane.normal.X +
                      (this->plane).plane.D) * (this->plane).plane.negiC;
              dVar2 = (light->super_AActor).__Pos.Z;
              if (((dVar4 < dVar2) && (this->ceiling != false)) ||
                 ((dVar2 < dVar4 && (this->ceiling != true)))) goto LAB_0043ca47;
            }
            Plane::Set(&local_44,&(this->plane).plane);
            gl_GetLight(sub->sector->PortalGroup,&local_44,light,false,&lightdata);
          }
LAB_0043ca47:
          pFVar3 = pFVar3->nextLight;
        } while (pFVar3 != (FLightNode *)0x0);
      }
      index = FLightBuffer::UploadLights(GLRenderer->mLights,&lightdata);
      if (pass == 1) {
        this_00 = GLRenderer->mLights;
        TArray<int,_int>::Grow(&this_00->mIndices,1);
        (this_00->mIndices).Array[(this_00->mIndices).Count] = index;
        puVar1 = &(this_00->mIndices).Count;
        *puVar1 = *puVar1 + 1;
      }
      else {
        FRenderState::ApplyLightIndex(&gl_RenderState,index);
      }
    }
    else {
      FRenderState::ApplyLightIndex(&gl_RenderState,(GLRenderer->mLights->mIndices).Array[*dli]);
      *dli = *dli + 1;
    }
  }
  return;
}

Assistant:

void GLFlat::SetupSubsectorLights(int pass, subsector_t * sub, int *dli)
{
	Plane p;

	if (renderstyle == STYLE_Add) return;	// no lights on additively blended surfaces.

	if (dli != NULL && *dli != -1)
	{
		gl_RenderState.ApplyLightIndex(GLRenderer->mLights->GetIndex(*dli));
		(*dli)++;
		return;
	}

	lightdata.Clear();
	FLightNode * node = sub->lighthead;
	while (node)
	{
		ADynamicLight * light = node->lightsource;
			
		if (light->flags2&MF2_DORMANT)
		{
			node=node->nextLight;
			continue;
		}
		iter_dlightf++;

		// we must do the side check here because gl_SetupLight needs the correct plane orientation
		// which we don't have for Legacy-style 3D-floors
		double planeh = plane.plane.ZatPoint(light);
		if (gl_lights_checkside && ((planeh<light->Z() && ceiling) || (planeh>light->Z() && !ceiling)))
		{
			node = node->nextLight;
			continue;
		}

		p.Set(plane.plane);
		gl_GetLight(sub->sector->PortalGroup, p, light, false, lightdata);
		node = node->nextLight;
	}

	int d = GLRenderer->mLights->UploadLights(lightdata);
	if (pass == GLPASS_LIGHTSONLY)
	{
		GLRenderer->mLights->StoreIndex(d);
	}
	else
	{
		gl_RenderState.ApplyLightIndex(d);
	}
}